

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

int __thiscall jrtplib::RTPUDPv4Transmitter::SetReceiveMode(RTPUDPv4Transmitter *this,ReceiveMode m)

{
  int iVar1;
  
  if (this->init == true) {
    if (this->created == true) {
      iVar1 = 0;
      if (this->receivemode != m) {
        this->receivemode = m;
        RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
        ::Clear(&this->acceptignoreinfo);
      }
    }
    else {
      iVar1 = -0x59;
    }
  }
  else {
    iVar1 = -0x5a;
  }
  return iVar1;
}

Assistant:

int RTPUDPv4Transmitter::SetReceiveMode(RTPTransmitter::ReceiveMode m)
{
	if (!init)
		return ERR_RTP_UDPV4TRANS_NOTINIT;
	
	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV4TRANS_NOTCREATED;
	}
	if (m != receivemode)
	{
		receivemode = m;
		acceptignoreinfo.Clear();
	}
	MAINMUTEX_UNLOCK
	return 0;
}